

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

void __thiscall
mjs::global_object_impl::global_object_impl
          (global_object_impl *this,gc_heap *h,version ver,bool *strict_mode)

{
  slot *psVar1;
  allocation_result aVar2;
  gc_table local_90;
  bool *local_80;
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [32];
  char *local_48;
  string_view local_40;
  
  local_40._M_len = 6;
  local_40._M_str = "Global";
  string::string((string *)&local_90,h,&local_40);
  local_68._24_4_ = 6;
  local_68._28_4_ = 0;
  local_48 = "Object";
  string::string((string *)&local_78,h,(string_view *)(local_68 + 0x18));
  local_68._16_8_ = (slot *)0x0;
  gc_heap::allocate_and_construct<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)local_68,(size_t)h,(string *)0x20,&local_78.heap_);
  local_80 = strict_mode;
  object::object((object *)this,(string *)&local_90,(object_ptr *)local_68);
  (this->super_global_object).super_object._vptr_object = (_func_int **)&PTR_get_001f2490;
  *(undefined8 *)&(this->super_global_object).stack_trace_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_global_object).stack_trace_.super__Function_base._M_functor + 8) = 0;
  (this->super_global_object).stack_trace_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_global_object).stack_trace_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_global_object).strict_mode_func_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_global_object).strict_mode_func_.super__Function_base._M_functor + 8) = 0;
  (this->super_global_object).strict_mode_func_.super__Function_base._M_manager = (_Manager_type)0x0
  ;
  (this->super_global_object).strict_mode_func_._M_invoker = (_Invoker_type)0x0;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90);
  (this->super_global_object).super_object._vptr_object = (_func_int **)&PTR_get_001f23e0;
  aVar2 = gc_heap::allocation_context::allocate(&h->alloc_context_,0x10);
  psVar1 = aVar2.obj;
  if (*(int *)((long)psVar1 + -4) == -1) {
    *psVar1 = (slot)h;
    gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table::make<>(&local_90,h,0x10);
    psVar1[1].new_position = local_90.capacity_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90);
    *(undefined4 *)((long)psVar1 + -4) =
         gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>>
         ::reg._40_4_;
    local_90.heap_ = h;
    local_90.capacity_ = aVar2.pos;
    gc_heap::attach(h,(gc_heap_ptr_untyped *)&local_90);
    (this->string_cache_).entries_.pos_ = local_90.capacity_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90);
    this->error_prototype_[5] = 0;
    this->error_prototype_[6] = 0;
    *(undefined8 *)(this->error_prototype_ + 7) = 0;
    this->error_prototype_[1] = 0;
    this->error_prototype_[2] = 0;
    this->error_prototype_[3] = 0;
    this->error_prototype_[4] = 0;
    this->boolean_prototype_ = 0;
    this->number_prototype_ = 0;
    this->regexp_prototype_ = 0;
    this->error_prototype_[0] = 0;
    this->object_prototype_ = 0;
    this->function_prototype_ = 0;
    this->array_prototype_ = 0;
    this->string_prototype_ = 0;
    (this->super_global_object).version_ = ver;
    (this->super_global_object).strict_mode_ = local_80;
    return;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>, Args = <mjs::gc_heap &, unsigned int &>]"
               );
}

Assistant:

explicit global_object_impl(gc_heap& h, version ver, bool& strict_mode)
        : global_object(string{h, "Global"}
            , h.make<object>(string{h, "Object"}, nullptr))
        , string_cache_(h, 16) {
        version_ = ver;
        strict_mode_ = &strict_mode;
    }